

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void libtorrent::aux::anon_unknown_119::put_mutable_callback
               (item *i,function<void_(libtorrent::entry_&,_std::array<char,_64UL>_&,_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *cb)

{
  pointer pcVar1;
  span<const_char> salt_00;
  sequence_number seq;
  string salt;
  entry value;
  public_key pk;
  signature sig;
  sequence_number local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  entry local_d0;
  public_key local_a8;
  array<char,_64UL> local_88;
  entry local_48;
  
  entry::entry(&local_d0,&i->m_value);
  local_88._M_elems._0_8_ = *(undefined8 *)(i->m_sig).bytes._M_elems;
  local_88._M_elems._8_8_ = *(undefined8 *)((i->m_sig).bytes._M_elems + 8);
  local_88._M_elems._16_8_ = *(undefined8 *)((i->m_sig).bytes._M_elems + 0x10);
  local_88._M_elems._24_8_ = *(undefined8 *)((i->m_sig).bytes._M_elems + 0x18);
  local_88._M_elems._32_4_ = *(undefined4 *)((i->m_sig).bytes._M_elems + 0x20);
  local_88._M_elems._36_4_ = *(undefined4 *)((i->m_sig).bytes._M_elems + 0x24);
  local_88._M_elems._40_4_ = *(undefined4 *)((i->m_sig).bytes._M_elems + 0x28);
  local_88._M_elems._44_4_ = *(undefined4 *)((i->m_sig).bytes._M_elems + 0x2c);
  local_88._M_elems._48_4_ = *(undefined4 *)((i->m_sig).bytes._M_elems + 0x30);
  local_88._M_elems._52_4_ = *(undefined4 *)((i->m_sig).bytes._M_elems + 0x34);
  local_88._M_elems._56_4_ = *(undefined4 *)((i->m_sig).bytes._M_elems + 0x38);
  local_88._M_elems._60_4_ = *(undefined4 *)((i->m_sig).bytes._M_elems + 0x3c);
  local_a8.bytes._M_elems._0_4_ = *(undefined4 *)(i->m_pk).bytes._M_elems;
  local_a8.bytes._M_elems._4_4_ = *(undefined4 *)((i->m_pk).bytes._M_elems + 4);
  local_a8.bytes._M_elems._8_4_ = *(undefined4 *)((i->m_pk).bytes._M_elems + 8);
  local_a8.bytes._M_elems._12_4_ = *(undefined4 *)((i->m_pk).bytes._M_elems + 0xc);
  local_a8.bytes._M_elems._16_4_ = *(undefined4 *)((i->m_pk).bytes._M_elems + 0x10);
  local_a8.bytes._M_elems._20_4_ = *(undefined4 *)((i->m_pk).bytes._M_elems + 0x14);
  local_a8.bytes._M_elems._24_4_ = *(undefined4 *)((i->m_pk).bytes._M_elems + 0x18);
  local_a8.bytes._M_elems._28_4_ = *(undefined4 *)((i->m_pk).bytes._M_elems + 0x1c);
  local_f8.value = (i->m_seq).value;
  pcVar1 = (i->m_salt)._M_dataplus._M_p;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar1,pcVar1 + (i->m_salt)._M_string_length);
  if ((cb->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*cb->_M_invoker)((_Any_data *)cb,&local_d0,&local_88,&local_f8.value,&local_f0);
    entry::entry(&local_48,&local_d0);
    salt_00.m_len = local_f0._M_string_length;
    salt_00.m_ptr = local_f0._M_dataplus._M_p;
    dht::item::assign(i,&local_48,salt_00,local_f8,&local_a8,(signature *)&local_88);
    entry::~entry(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    entry::~entry(&local_d0);
    return;
  }
  ::std::__throw_bad_function_call();
}

Assistant:

void put_mutable_callback(dht::item& i
			, std::function<void(entry&, std::array<char, 64>&
				, std::int64_t&, std::string const&)> cb)
		{
			entry value = i.value();
			dht::signature sig = i.sig();
			dht::public_key pk = i.pk();
			dht::sequence_number seq = i.seq();
			std::string salt = i.salt();
			cb(value, sig.bytes, seq.value, salt);
			i.assign(std::move(value), salt, seq, pk, sig);
		}